

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int av1_init_search_range(int size)

{
  int local_10;
  int local_c;
  int sr;
  int size_local;
  
  sr = 0;
  local_c = size;
  if (size < 0x10) {
    local_c = 0x10;
  }
  for (; local_c << ((byte)sr & 0x1f) < 0x3ff; sr = sr + 1) {
  }
  if (sr < 9) {
    local_10 = sr;
  }
  else {
    local_10 = 9;
  }
  return local_10;
}

Assistant:

int av1_init_search_range(int size) {
  int sr = 0;
  // Minimum search size no matter what the passed in value.
  size = AOMMAX(16, size);

  while ((size << sr) < MAX_FULL_PEL_VAL) sr++;

  sr = AOMMIN(sr, MAX_MVSEARCH_STEPS - 2);
  return sr;
}